

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void __thiscall
pbrt::CurveCommon::CurveCommon
          (CurveCommon *this,span<const_pbrt::Point3<float>_> c,Float width0,Float width1,
          CurveType type,span<const_pbrt::Normal3<float>_> norm,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation)

{
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  Point3<float> *pPVar4;
  undefined4 in_ECX;
  char (*in_RDI) [2];
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  Float FVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  uint in_XMM1_Da;
  Normal3<float> NVar10;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  byte in_stack_00000018;
  Transform *in_stack_00000050;
  int i;
  int vb;
  size_t va;
  span<const_pbrt::Normal3<float>_> *this_00;
  Normal3<float> *b;
  Normal3<float> *a;
  char (*args) [9];
  char (*fmt) [2];
  undefined8 in_stack_ffffffffffffff70;
  int line;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  LogLevel level;
  undefined8 in_stack_ffffffffffffff84;
  char (*in_stack_ffffffffffffff90) [9];
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char (*in_stack_ffffffffffffffa0) [2];
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  span<const_pbrt::Normal3<float>_> local_28;
  span<const_pbrt::Point3<float>_> local_18;
  
  *(undefined4 *)in_RDI = in_ECX;
  fmt = in_RDI + 2;
  args = (char (*) [9])(in_RDI + 0x1a);
  do {
    Point3<float>::Point3((Point3<float> *)0x45efd3);
    fmt = (char (*) [2])(fmt[4] + 1 + 3);
  } while ((char (*) [9])fmt != args);
  a = (Normal3<float> *)(in_RDI + 0x1e);
  b = (Normal3<float> *)(in_RDI + 0x2a);
  do {
    Normal3<float>::Normal3((Normal3<float> *)0x45f014);
    level = (LogLevel)in_stack_ffffffffffffff84;
    line = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    a = a + 1;
  } while (a != b);
  *(undefined8 *)(in_RDI + 0x30) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x34) = in_stack_00000010;
  in_RDI[0x38][0] = in_stack_00000018 & 1;
  bVar2 = Transform::SwapsHandedness(in_stack_00000050);
  in_RDI[0x38][1] = bVar2;
  *(undefined4 *)(in_RDI + 0x1a) = in_XMM0_Da;
  auVar7 = ZEXT464(in_XMM1_Da);
  *(uint *)(in_RDI + 0x1c) = in_XMM1_Da;
  sVar3 = pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
  if (sVar3 != 4) {
    LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],unsigned_long&,char_const(&)[2],int&>
              (level,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),line,*fmt
               ,args,in_RDI,in_stack_ffffffffffffff90,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffffa0,
               (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  for (local_50 = 0; auVar9 = auVar7._8_56_, local_50 < 4; local_50 = local_50 + 1) {
    pPVar4 = pstd::span<const_pbrt::Point3<float>_>::operator[](&local_18,(long)local_50);
    *(undefined8 *)(in_RDI + (long)local_50 * 6 + 2) =
         *(undefined8 *)&pPVar4->super_Tuple3<pbrt::Point3,_float>;
    *(float *)(in_RDI + (long)local_50 * 6 + 2 + 4) = (pPVar4->super_Tuple3<pbrt::Point3,_float>).z;
  }
  sVar3 = pstd::span<const_pbrt::Normal3<float>_>::size(&local_28);
  if (sVar3 == 2) {
    this_00 = &local_28;
    pstd::span<const_pbrt::Normal3<float>_>::operator[](this_00,0);
    NVar10 = Normalize<float>((Normal3<float> *)this_00);
    auVar7._0_8_ = NVar10.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    uVar1 = vmovlpd_avx(auVar7._0_16_);
    *(float *)(in_RDI + 0x22) = NVar10.super_Tuple3<pbrt::Normal3,_float>.z;
    *(undefined8 *)(in_RDI + 0x1e) = uVar1;
    pstd::span<const_pbrt::Normal3<float>_>::operator[](this_00,1);
    NVar10 = Normalize<float>((Normal3<float> *)this_00);
    auVar8._0_8_ = NVar10.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    *(undefined8 *)(in_RDI + 0x24) = uVar1;
    *(float *)(in_RDI + 0x28) = NVar10.super_Tuple3<pbrt::Normal3,_float>.z;
    FVar5 = AngleBetween<float>(a,b);
    *(Float *)(in_RDI + 0x2a) = FVar5;
    dVar6 = std::sin((double)(ulong)*(uint *)(in_RDI + 0x2a));
    *(float *)(in_RDI + 0x2c) = 1.0 / SUB84(dVar6,0);
  }
  *(long *)(*in_FS_OFFSET + -0x480) = *(long *)(*in_FS_OFFSET + -0x480) + 1;
  return;
}

Assistant:

CurveCommon::CurveCommon(pstd::span<const Point3f> c, Float width0, Float width1,
                         CurveType type, pstd::span<const Normal3f> norm,
                         const Transform *renderFromObject,
                         const Transform *objectFromRender, bool reverseOrientation)
    : type(type),
      renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()) {
    width[0] = width0;
    width[1] = width1;
    CHECK_EQ(c.size(), 4);
    for (int i = 0; i < 4; ++i)
        cpObj[i] = c[i];
    if (norm.size() == 2) {
        n[0] = Normalize(norm[0]);
        n[1] = Normalize(norm[1]);
        normalAngle = AngleBetween(n[0], n[1]);
        invSinNormalAngle = 1 / std::sin(normalAngle);
    }
    ++nCurves;
}